

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2b::BuildLogTestDoubleEntry::~BuildLogTestDoubleEntry
          (BuildLogTestDoubleEntry *this)

{
  BuildLogTestDoubleEntry *this_local;
  
  ~BuildLogTestDoubleEntry(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

TEST_F(BuildLogTest, DoubleEntry) {
  FILE* f = fopen(kTestFilename, "wb");
  fprintf(f, "# ninja log v4\n");
  fprintf(f, "0\t1\t2\tout\tcommand abc\n");
  fprintf(f, "3\t4\t5\tout\tcommand def\n");
  fclose(f);

  string err;
  BuildLog log;
  EXPECT_TRUE(log.Load(kTestFilename, &err));
  ASSERT_EQ("", err);

  BuildLog::LogEntry* e = log.LookupByOutput("out");
  ASSERT_TRUE(e);
  ASSERT_NO_FATAL_FAILURE(AssertHash("command def", e->command_hash));
}